

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

_Bool ssh2_transport_get_specials(PacketProtocolLayer *ppl,add_special_fn_t add_special,void *ctx)

{
  int iVar1;
  char cVar2;
  long lVar3;
  
  cVar2 = (**(code **)(*ppl[-0xd].ic_process_queue.ctx + 0x10))();
  if ((ppl->remote_bugs & 0x40) == 0) {
    if (cVar2 != '\0') {
      (*add_special)(ctx,(char *)0x0,SS_SEP,0);
    }
    (*add_special)(ctx,"Repeat key exchange",SS_REKEY,0);
    cVar2 = '\x01';
    if (*(int *)((long)&ppl[-1].seat + 4) != 0) {
      (*add_special)(ctx,(char *)0x0,SS_SEP,0);
      (*add_special)(ctx,"Cache new host key type",SS_SUBMENU,0);
      for (lVar3 = 0; lVar3 < *(int *)((long)&ppl[-1].seat + 4); lVar3 = lVar3 + 1) {
        iVar1 = *(int *)((long)ppl + lVar3 * 4 + -0x60);
        (*add_special)(ctx,(ssh2_hostkey_algs[iVar1].alg)->ssh_id,SS_XCERT,iVar1);
      }
      (*add_special)(ctx,(char *)0x0,SS_EXITMENU,0);
      cVar2 = '\x01';
    }
  }
  return (_Bool)cVar2;
}

Assistant:

static bool ssh2_transport_get_specials(
    PacketProtocolLayer *ppl, add_special_fn_t add_special, void *ctx)
{
    struct ssh2_transport_state *s =
        container_of(ppl, struct ssh2_transport_state, ppl);
    bool need_separator = false;
    bool toret = false;

    if (ssh_ppl_get_specials(s->higher_layer, add_special, ctx)) {
        need_separator = true;
        toret = true;
    }

    /*
     * Don't bother offering rekey-based specials if we've decided the
     * remote won't cope with it, since we wouldn't bother sending it
     * if asked anyway.
     */
    if (!(s->ppl.remote_bugs & BUG_SSH2_REKEY)) {
        if (need_separator) {
            add_special(ctx, NULL, SS_SEP, 0);
            need_separator = false;
        }

        add_special(ctx, "Repeat key exchange", SS_REKEY, 0);
        toret = true;

        if (s->n_uncert_hostkeys) {
            int i;

            add_special(ctx, NULL, SS_SEP, 0);
            add_special(ctx, "Cache new host key type", SS_SUBMENU, 0);
            for (i = 0; i < s->n_uncert_hostkeys; i++) {
                const ssh_keyalg *alg =
                    ssh2_hostkey_algs[s->uncert_hostkeys[i]].alg;

                add_special(ctx, alg->ssh_id, SS_XCERT, s->uncert_hostkeys[i]);
            }
            add_special(ctx, NULL, SS_EXITMENU, 0);
        }
    }

    return toret;
}